

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsPostsolveStack.h
# Opt level: O2

void __thiscall
presolve::HighsPostsolveStack::doubletonEquation<HighsEmptySlice>
          (HighsPostsolveStack *this,HighsInt row,HighsInt colSubst,HighsInt col,double coefSubst,
          double coef,double rhs,double substLower,double substUpper,double substCost,
          bool lowerTightened,bool upperTightened,RowType rowType,
          HighsMatrixSlice<HighsEmptySlice> *colVec)

{
  pointer pNVar1;
  pointer piVar2;
  DoubletonEquation local_60;
  
  pNVar1 = (this->colValues).
           super__Vector_base<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->colValues).
      super__Vector_base<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
      ._M_impl.super__Vector_impl_data._M_finish != pNVar1) {
    (this->colValues).
    super__Vector_base<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
    ._M_impl.super__Vector_impl_data._M_finish = pNVar1;
  }
  if (row == -1) {
    local_60.row = -1;
  }
  else {
    local_60.row = (this->origRowIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[row];
  }
  piVar2 = (this->origColIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_60.colSubst = piVar2[colSubst];
  local_60.col = piVar2[col];
  local_60.rowType = rowType;
  local_60.coef = coef;
  local_60.coefSubst = coefSubst;
  local_60.rhs = rhs;
  local_60.substLower = substLower;
  local_60.substUpper = substUpper;
  local_60.substCost = substCost;
  local_60.lowerTightened = lowerTightened;
  local_60.upperTightened = upperTightened;
  HighsDataStack::push<presolve::HighsPostsolveStack::DoubletonEquation,_0>
            (&this->reductionValues,&local_60);
  HighsDataStack::push<presolve::HighsPostsolveStack::Nonzero>
            (&this->reductionValues,&this->colValues);
  reductionAdded(this,kDoubletonEquation);
  return;
}

Assistant:

void doubletonEquation(HighsInt row, HighsInt colSubst, HighsInt col,
                         double coefSubst, double coef, double rhs,
                         double substLower, double substUpper, double substCost,
                         bool lowerTightened, bool upperTightened,
                         RowType rowType,
                         const HighsMatrixSlice<ColStorageFormat>& colVec) {
    colValues.clear();
    for (const HighsSliceNonzero& colVal : colVec)
      colValues.emplace_back(origRowIndex[colVal.index()], colVal.value());

    reductionValues.push(DoubletonEquation{
        coef, coefSubst, rhs, substLower, substUpper, substCost,
        row == -1 ? -1 : origRowIndex[row], origColIndex[colSubst],
        origColIndex[col], lowerTightened, upperTightened, rowType});
    reductionValues.push(colValues);
    reductionAdded(ReductionType::kDoubletonEquation);
  }